

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O0

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,FieldInvocation *ptr)

{
  VariableSymbol *pVVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *this_00;
  reference ppVVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  VariableSymbol *field;
  iterator __end1;
  iterator __begin1;
  vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_> *__range1;
  bool field_exists;
  FieldInvocation *ptr_local;
  symbol_table_visitor *this_local;
  
  bVar2 = false;
  this_00 = &this->curr_class->fields;
  __end1 = std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>::begin(this_00);
  field = (VariableSymbol *)
          std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>::end(this_00);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
                                *)&field);
    if (!bVar3) {
LAB_0013654f:
      if (bVar2) {
        return;
      }
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(__return_storage_ptr__,"syntax error: can\'t find field ",ptr->name);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    ppVVar5 = __gnu_cxx::
              __normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
              ::operator*(&__end1);
    pVVar1 = *ppVVar5;
    _Var4 = std::operator==(&(pVVar1->super_BaseSymbol).name,ptr->name);
    if (_Var4) {
      bVar2 = true;
      ptr->type = pVVar1->type;
      goto LAB_0013654f;
    }
    __gnu_cxx::
    __normal_iterator<VariableSymbol_**,_std::vector<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void symbol_table_visitor::visit(FieldInvocation* ptr) {
    bool field_exists = false;
    for(auto field : curr_class->fields) {
        if (field->name == *ptr->name) {
            field_exists = true;
            ptr->type = field->type;
            break;
        }
    }
    if (!field_exists) {
        throw "syntax error: can't find field " + *ptr->name;
    }
    //name
}